

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O2

void google::glog_internal_namespace_::ShutdownGoogleLoggingUtilities(void)

{
  ostream *poVar1;
  LogMessage LStack_18;
  
  if (g_program_invocation_short_name != 0) {
    g_program_invocation_short_name = 0;
    closelog();
    return;
  }
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/utilities.cc"
             ,0x169);
  poVar1 = LogMessage::stream(&LStack_18);
  poVar1 = std::operator<<(poVar1,"Check failed: IsGoogleLoggingInitialized() ");
  std::operator<<(poVar1,
                  "You called ShutdownGoogleLogging() without calling InitGoogleLogging() first!");
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18);
}

Assistant:

bool IsGoogleLoggingInitialized() {
  return g_program_invocation_short_name != NULL;
}